

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1da1d1::BracedRangeExpr::printLeft(BracedRangeExpr *this,OutputStream *S)

{
  Kind KVar1;
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  BracedRangeExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  OutputStream::operator+=(S,'[');
  Node::print(this->First,local_18);
  StringView::StringView(&local_28," ... ");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->Last,local_18);
  OutputStream::operator+=(local_18,']');
  KVar1 = Node::getKind(this->Init);
  if (KVar1 != KBracedExpr) {
    KVar1 = Node::getKind(this->Init);
    if (KVar1 != KBracedRangeExpr) {
      StringView::StringView(&local_38," = ");
      OutputStream::operator+=(local_18,local_38);
    }
  }
  Node::print(this->Init,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += '[';
    First->print(S);
    S += " ... ";
    Last->print(S);
    S += ']';
    if (Init->getKind() != KBracedExpr && Init->getKind() != KBracedRangeExpr)
      S += " = ";
    Init->print(S);
  }